

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O2

ModelWireSegment * __thiscall lsim::ModelWire::segment_at_point(ModelWire *this,Point *p)

{
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  
  puVar3 = (this->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      return (ModelWireSegment *)0x0;
    }
    bVar2 = ModelWireSegment::point_on_segment
                      ((puVar3->_M_t).
                       super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                       .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,p);
    if (bVar2) break;
    puVar3 = puVar3 + 1;
  }
  return (puVar3->_M_t).
         super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
         ._M_t.
         super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
         .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
}

Assistant:

ModelWireSegment *ModelWire::segment_at_point(const Point &p) const {
    for (const auto &segment : m_segments) {
        if (segment->point_on_segment(p)) {
            return segment.get();
        }
    }

    return nullptr;
}